

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

void __thiscall
flatbuffers::cpp::CppGenerator::GenMiniReflect
          (CppGenerator *this,StructDef *struct_def,EnumDef *enum_def)

{
  CodeWriter *this_00;
  char cVar1;
  BaseType BVar2;
  BaseType BVar3;
  pointer ppEVar4;
  pointer ppEVar5;
  pointer ppFVar6;
  EnumDef *def;
  pointer ppEVar7;
  undefined8 uVar8;
  _Alloc_hider *p_Var9;
  SymbolTable<flatbuffers::EnumVal> *pSVar10;
  SymbolTable<flatbuffers::EnumVal> *pSVar11;
  pointer pTVar12;
  pointer puVar13;
  __type _Var14;
  char *pcVar15;
  pointer pbVar16;
  EnumVal *pEVar17;
  uint64_t uVar18;
  bool bVar19;
  StructDef *pSVar20;
  int t;
  pointer pTVar21;
  pointer ppEVar22;
  char *pcVar23;
  FieldDef **field;
  Type *pTVar24;
  pointer puVar25;
  pointer ppFVar26;
  uint uVar27;
  ulong uVar28;
  pointer pbVar29;
  long lVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  allocator<char> local_499;
  string ts;
  string rs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  type_refs;
  string vs;
  string as;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string ns;
  vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_> types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<unsigned_short,_std::allocator<unsigned_short>_> array_sizes;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&ts,"NAME",(allocator<char> *)&rs);
  this_00 = &this->code_;
  pSVar20 = struct_def;
  if (struct_def == (StructDef *)0x0) {
    pSVar20 = (StructDef *)enum_def;
  }
  CodeWriter::SetValue(this_00,&ts,(string *)pSVar20);
  std::__cxx11::string::~string((string *)&ts);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ts,"SEQ_TYPE",(allocator<char> *)&as);
  if (struct_def == (StructDef *)0x0) {
    pcVar15 = "ST_UNION";
    pcVar23 = "ST_ENUM";
    cVar1 = enum_def->is_union;
  }
  else {
    pcVar15 = "ST_STRUCT";
    pcVar23 = "ST_TABLE";
    cVar1 = struct_def->fixed;
  }
  if (cVar1 != '\0') {
    pcVar23 = pcVar15;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&rs,pcVar23,(allocator<char> *)&ns);
  CodeWriter::SetValue(this_00,&ts,&rs);
  std::__cxx11::string::~string((string *)&rs);
  std::__cxx11::string::~string((string *)&ts);
  pSVar10 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  pSVar11 = (SymbolTable<flatbuffers::EnumVal> *)&struct_def->fields;
  if (struct_def == (StructDef *)0x0) {
    pSVar10 = &enum_def->vals;
    pSVar11 = &enum_def->vals;
  }
  ppEVar4 = (pSVar11->vec).
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppEVar5 = (pSVar10->vec).
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ts,"NUM_FIELDS",(allocator<char> *)&as);
  NumToString<unsigned_long>(&rs,(long)ppEVar4 - (long)ppEVar5 >> 3);
  CodeWriter::SetValue(this_00,&ts,&rs);
  std::__cxx11::string::~string((string *)&rs);
  std::__cxx11::string::~string((string *)&ts);
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (struct_def == (StructDef *)0x0) {
    for (ppEVar22 = (enum_def->vals).vec.
                    super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        ppEVar22 !=
        (enum_def->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppEVar22 = ppEVar22 + 1) {
      pEVar17 = *ppEVar22;
      EscapeKeyword(&ts,this,&pEVar17->name);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ts);
      std::__cxx11::string::~string((string *)&ts);
      pTVar24 = &pEVar17->union_type;
      if (enum_def->is_union == false) {
        pTVar24 = &enum_def->underlying_type;
      }
      ts._M_dataplus._M_p = *(pointer *)pTVar24;
      uVar8 = *(undefined8 *)((long)&pTVar24->struct_def + 2);
      ts.field_2._2_8_ = *(undefined8 *)((long)&pTVar24->enum_def + 2);
      ts.field_2._M_local_buf[0] = (char)((ulong)uVar8 >> 0x30);
      ts.field_2._M_local_buf[1] = (char)((ulong)uVar8 >> 0x38);
      ts._M_string_length._0_2_ = SUB82(pTVar24->struct_def,0);
      ts._M_string_length._2_6_ = (undefined6)((ulong)pTVar24->struct_def >> 0x10);
      std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::push_back
                (&types,(value_type *)&ts);
    }
  }
  else {
    ppFVar6 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppFVar26 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppFVar26 != ppFVar6;
        ppFVar26 = ppFVar26 + 1) {
      Name_abi_cxx11_(&ts,this,*ppFVar26);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,&ts);
      std::__cxx11::string::~string((string *)&ts);
      std::vector<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::push_back
                (&types,&((*ppFVar26)->value).type);
    }
  }
  pTVar12 = types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ts._M_dataplus._M_p = (pointer)&ts.field_2;
  ts._M_string_length._0_2_ = 0;
  ts._M_string_length._2_6_ = 0;
  ts.field_2._M_local_buf[0] = '\0';
  type_refs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type_refs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  type_refs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pTVar21 = types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    pbVar29 = type_refs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pTVar21 == pTVar12) {
      rs._M_dataplus._M_p = (pointer)&rs.field_2;
      rs._M_string_length = 0;
      rs.field_2._M_local_buf[0] = '\0';
      for (pbVar16 = type_refs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          puVar13 = array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_finish, pbVar16 != pbVar29;
          pbVar16 = pbVar16 + 1) {
        if (rs._M_string_length != 0) {
          std::__cxx11::string::append((char *)&rs);
        }
        std::operator+(&as,pbVar16,"TypeTable");
        std::__cxx11::string::append((string *)&rs);
        std::__cxx11::string::~string((string *)&as);
      }
      as._M_dataplus._M_p = (pointer)&as.field_2;
      as._M_string_length = 0;
      as.field_2._M_local_buf[0] = '\0';
      for (puVar25 = array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar29 = names.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish, puVar25 != puVar13;
          puVar25 = puVar25 + 1) {
        NumToString<unsigned_short>(&ns,*puVar25);
        std::__cxx11::string::append((string *)&as);
        std::__cxx11::string::~string((string *)&ns);
        std::__cxx11::string::append((char *)&as);
      }
      ns._M_dataplus._M_p = (pointer)&ns.field_2;
      ns._M_string_length = 0;
      ns.field_2._M_local_buf[0] = '\0';
      for (pbVar16 = names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar16 != pbVar29;
          pbVar16 = pbVar16 + 1) {
        if (ns._M_string_length != 0) {
          std::__cxx11::string::append((char *)&ns);
        }
        std::operator+(&local_4c0,"\"",pbVar16);
        std::operator+(&vs,&local_4c0,"\"");
        std::__cxx11::string::append((string *)&ns);
        std::__cxx11::string::~string((string *)&vs);
        std::__cxx11::string::~string((string *)&local_4c0);
      }
      vs._M_dataplus._M_p = (pointer)&vs.field_2;
      vs._M_string_length = 0;
      vs.field_2._M_local_buf[0] = '\0';
      if ((enum_def == (EnumDef *)0x0) ||
         ((pEVar17 = EnumDef::MinValue(enum_def), pEVar17->value == 0 &&
          (ppEVar22 = (enum_def->vals).vec.
                      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
          ppEVar7 = (enum_def->vals).vec.
                    super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish, uVar18 = EnumDef::Distance(enum_def)
          , ((long)ppEVar7 - (long)ppEVar22 >> 3) - 1U == uVar18)))) {
        if ((struct_def != (StructDef *)0x0) && (struct_def->fixed == true)) {
          ppFVar6 = (struct_def->fields).vec.
                    super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppFVar26 = (struct_def->fields).vec.
                          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppFVar26 != ppFVar6;
              ppFVar26 = ppFVar26 + 1) {
            NumToString<unsigned_short>(&local_4c0,((*ppFVar26)->value).offset);
            std::__cxx11::string::append((string *)&vs);
            std::__cxx11::string::~string((string *)&local_4c0);
            std::__cxx11::string::append((char *)&vs);
          }
          NumToString<unsigned_long>(&local_4c0,struct_def->bytesize);
          std::__cxx11::string::append((string *)&vs);
          std::__cxx11::string::~string((string *)&local_4c0);
        }
      }
      else {
        for (ppEVar22 = (enum_def->vals).vec.
                        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppEVar22 !=
            (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppEVar22 = ppEVar22 + 1) {
          pEVar17 = *ppEVar22;
          if (vs._M_string_length != 0) {
            std::__cxx11::string::append((char *)&vs);
          }
          EnumDef::ToString_abi_cxx11_(&local_50,enum_def,pEVar17);
          NumToStringCpp(&local_4c0,&local_50,(enum_def->underlying_type).base_type);
          std::__cxx11::string::append((string *)&vs);
          std::__cxx11::string::~string((string *)&local_4c0);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"TYPES",(allocator<char> *)&local_3e0);
      CodeWriter::SetValue(this_00,&local_4c0,&ts);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"REFS",(allocator<char> *)&local_3e0);
      CodeWriter::SetValue(this_00,&local_4c0,&rs);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"ARRAYSIZES",(allocator<char> *)&local_3e0);
      CodeWriter::SetValue(this_00,&local_4c0,&as);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"NAMES",(allocator<char> *)&local_3e0);
      CodeWriter::SetValue(this_00,&local_4c0,&ns);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c0,"VALUES",(allocator<char> *)&local_3e0);
      CodeWriter::SetValue(this_00,&local_4c0,&vs);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {",
                 (allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (ppEVar4 != ppEVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"  static const ::flatbuffers::TypeCode type_codes[] = {",
                   (allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"    {{TYPES}}",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"  };",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
      }
      if (type_refs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          type_refs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"  static const ::flatbuffers::TypeFunction type_refs[] = {"
                   ,(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"    {{REFS}}",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_150,"  };",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
      }
      if (as._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_170,"  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };"
                   ,(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
      if (vs._M_string_length != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"  static const int64_t values[] = { {{VALUES}} };",
                   (allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
      }
      bVar19 = (this->opts_).super_IDLOptions.mini_reflect == kTypesAndNames;
      if (bVar19 && ppEVar4 != ppEVar5) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b0,"  static const char * const names[] = {",
                   (allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,"    {{NAMES}}",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,"  };",(allocator<char> *)&local_4c0);
        CodeWriter::operator+=(this_00,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"  static const ::flatbuffers::TypeTable tt = {",
                 (allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ",
                 (allocator<char> *)&local_70);
      pcVar23 = "type_codes, ";
      if (ppEVar4 == ppEVar5) {
        pcVar23 = "nullptr, ";
      }
      std::operator+(&local_2f0,&local_310,pcVar23);
      pcVar23 = "type_refs, ";
      if (type_refs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          type_refs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pcVar23 = "nullptr, ";
      }
      std::operator+(&local_2d0,&local_2f0,pcVar23);
      pcVar23 = "array_sizes, ";
      if (as._M_string_length == 0) {
        pcVar23 = "nullptr, ";
      }
      std::operator+(&local_3e0,&local_2d0,pcVar23);
      pcVar23 = "values, ";
      if (vs._M_string_length == 0) {
        pcVar23 = "nullptr, ";
      }
      std::operator+(&local_4c0,&local_3e0,pcVar23);
      pcVar23 = "nullptr";
      if (bVar19 && ppEVar4 != ppEVar5) {
        pcVar23 = "names";
      }
      std::operator+(&local_230,&local_4c0,pcVar23);
      CodeWriter::operator+=(this_00,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_310);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_250,"  };",(allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"  return &tt;",(allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"}",(allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"",(allocator<char> *)&local_4c0);
      CodeWriter::operator+=(this_00,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&vs);
      std::__cxx11::string::~string((string *)&ns);
      std::__cxx11::string::~string((string *)&as);
      std::__cxx11::string::~string((string *)&rs);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                (&array_sizes.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&type_refs);
      std::__cxx11::string::~string((string *)&ts);
      std::_Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>::~_Vector_base
                (&types.super__Vector_base<flatbuffers::Type,_std::allocator<flatbuffers::Type>_>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&names);
      return;
    }
    if (CONCAT62(ts._M_string_length._2_6_,(undefined2)ts._M_string_length) != 0) {
      std::__cxx11::string::append((char *)&ts);
    }
    BVar2 = pTVar21->base_type;
    bVar19 = BVar2 - BASE_TYPE_ARRAY < 2 || BVar2 == BASE_TYPE_VECTOR;
    BVar3 = (&pTVar21->base_type)[bVar19];
    pSVar20 = pTVar21->struct_def;
    if (pSVar20 == (StructDef *)0x0) {
      def = pTVar21->enum_def;
      if (def != (EnumDef *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&as,"",(allocator<char> *)&ns);
        BaseGenerator::WrapInNameSpace(&rs,&this->super_BaseGenerator,&def->super_Definition,&as);
        goto LAB_00159939;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&rs,"",(allocator<char> *)&as);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&as,"",(allocator<char> *)&ns);
      BaseGenerator::WrapInNameSpace(&rs,&this->super_BaseGenerator,&pSVar20->super_Definition,&as);
LAB_00159939:
      std::__cxx11::string::~string((string *)&as);
    }
    t = -1;
    if (rs._M_string_length != 0) {
      lVar30 = -(long)type_refs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
      for (pbVar29 = type_refs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar29 !=
          type_refs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar29 = pbVar29 + 1) {
        _Var14 = std::operator==(pbVar29,&rs);
        if (_Var14) {
          t = (int)((ulong)-((long)&((type_refs.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar30) >> 5);
          pbVar16 = type_refs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_001599a9;
        }
        lVar30 = lVar30 + -0x20;
      }
      t = -1;
      pbVar16 = pbVar29;
LAB_001599a9:
      if (pbVar29 == pbVar16) {
        p_Var9 = &(type_refs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&type_refs,&rs);
        t = (int)((ulong)-((long)&p_Var9->_M_p + lVar30) >> 5);
      }
    }
    if (BVar2 == BASE_TYPE_ARRAY) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (&array_sizes,&pTVar21->fixed_length);
    }
    uVar27 = BVar3 - BASE_TYPE_UTYPE;
    uVar28 = (ulong)uVar27;
    if (0xc < uVar27) {
      uVar28 = 0xd;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,*(char **)(ElementaryTypeNames()::names + uVar28 * 8),&local_499
              );
    std::operator+(&local_2d0,"{ ::flatbuffers::",&local_2f0);
    std::operator+(&local_3e0,&local_2d0,", ");
    NumToString<bool>(&local_310,bVar19);
    std::operator+(&local_4c0,&local_3e0,&local_310);
    std::operator+(&vs,&local_4c0,", ");
    NumToString<int>(&local_70,t);
    std::operator+(&ns,&vs,&local_70);
    std::operator+(&as,&ns," }");
    std::__cxx11::string::append((string *)&ts);
    std::__cxx11::string::~string((string *)&as);
    std::__cxx11::string::~string((string *)&ns);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&vs);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&rs);
    pTVar21 = pTVar21 + 1;
  } while( true );
}

Assistant:

void GenMiniReflect(const StructDef *struct_def, const EnumDef *enum_def) {
    code_.SetValue("NAME", struct_def ? struct_def->name : enum_def->name);
    code_.SetValue("SEQ_TYPE",
                   struct_def ? (struct_def->fixed ? "ST_STRUCT" : "ST_TABLE")
                              : (enum_def->is_union ? "ST_UNION" : "ST_ENUM"));
    auto num_fields =
        struct_def ? struct_def->fields.vec.size() : enum_def->size();
    code_.SetValue("NUM_FIELDS", NumToString(num_fields));
    std::vector<std::string> names;
    std::vector<Type> types;

    if (struct_def) {
      for (const auto &field : struct_def->fields.vec) {
        names.push_back(Name(*field));
        types.push_back(field->value.type);
      }
    } else {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        names.push_back(Name(ev));
        types.push_back(enum_def->is_union ? ev.union_type
                                           : Type(enum_def->underlying_type));
      }
    }
    std::string ts;
    std::vector<std::string> type_refs;
    std::vector<uint16_t> array_sizes;
    for (auto &type : types) {
      if (!ts.empty()) ts += ",\n    ";
      auto is_vector = IsVector(type);
      auto is_array = IsArray(type);
      auto bt = is_vector || is_array ? type.element : type.base_type;
      auto et = IsScalar(bt) || bt == BASE_TYPE_STRING
                    ? bt - BASE_TYPE_UTYPE + ET_UTYPE
                    : ET_SEQUENCE;
      int ref_idx = -1;
      std::string ref_name = type.struct_def ? WrapInNameSpace(*type.struct_def)
                             : type.enum_def ? WrapInNameSpace(*type.enum_def)
                                             : "";
      if (!ref_name.empty()) {
        auto rit = type_refs.begin();
        for (; rit != type_refs.end(); ++rit) {
          if (*rit == ref_name) {
            ref_idx = static_cast<int>(rit - type_refs.begin());
            break;
          }
        }
        if (rit == type_refs.end()) {
          ref_idx = static_cast<int>(type_refs.size());
          type_refs.push_back(ref_name);
        }
      }
      if (is_array) { array_sizes.push_back(type.fixed_length); }
      ts += "{ ::flatbuffers::" + std::string(ElementaryTypeNames()[et]) +
            ", " + NumToString(is_vector || is_array) + ", " +
            NumToString(ref_idx) + " }";
    }
    std::string rs;
    for (auto &type_ref : type_refs) {
      if (!rs.empty()) rs += ",\n    ";
      rs += type_ref + "TypeTable";
    }
    std::string as;
    for (auto &array_size : array_sizes) {
      as += NumToString(array_size);
      as += ", ";
    }
    std::string ns;
    for (auto &name : names) {
      if (!ns.empty()) ns += ",\n    ";
      ns += "\"" + name + "\"";
    }
    std::string vs;
    const auto consecutive_enum_from_zero =
        enum_def && enum_def->MinValue()->IsZero() &&
        ((enum_def->size() - 1) == enum_def->Distance());
    if (enum_def && !consecutive_enum_from_zero) {
      for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
           ++it) {
        const auto &ev = **it;
        if (!vs.empty()) vs += ", ";
        vs += NumToStringCpp(enum_def->ToString(ev),
                             enum_def->underlying_type.base_type);
      }
    } else if (struct_def && struct_def->fixed) {
      for (const auto field : struct_def->fields.vec) {
        vs += NumToString(field->value.offset);
        vs += ", ";
      }
      vs += NumToString(struct_def->bytesize);
    }
    code_.SetValue("TYPES", ts);
    code_.SetValue("REFS", rs);
    code_.SetValue("ARRAYSIZES", as);
    code_.SetValue("NAMES", ns);
    code_.SetValue("VALUES", vs);
    code_ += "inline const ::flatbuffers::TypeTable *{{NAME}}TypeTable() {";
    if (num_fields) {
      code_ += "  static const ::flatbuffers::TypeCode type_codes[] = {";
      code_ += "    {{TYPES}}";
      code_ += "  };";
    }
    if (!type_refs.empty()) {
      code_ += "  static const ::flatbuffers::TypeFunction type_refs[] = {";
      code_ += "    {{REFS}}";
      code_ += "  };";
    }
    if (!as.empty()) {
      code_ += "  static const int16_t array_sizes[] = { {{ARRAYSIZES}} };";
    }
    if (!vs.empty()) {
      // Problem with uint64_t values greater than 9223372036854775807ULL.
      code_ += "  static const int64_t values[] = { {{VALUES}} };";
    }
    auto has_names =
        num_fields && opts_.mini_reflect == IDLOptions::kTypesAndNames;
    if (has_names) {
      code_ += "  static const char * const names[] = {";
      code_ += "    {{NAMES}}";
      code_ += "  };";
    }
    code_ += "  static const ::flatbuffers::TypeTable tt = {";
    code_ += std::string("    ::flatbuffers::{{SEQ_TYPE}}, {{NUM_FIELDS}}, ") +
             (num_fields ? "type_codes, " : "nullptr, ") +
             (!type_refs.empty() ? "type_refs, " : "nullptr, ") +
             (!as.empty() ? "array_sizes, " : "nullptr, ") +
             (!vs.empty() ? "values, " : "nullptr, ") +
             (has_names ? "names" : "nullptr");
    code_ += "  };";
    code_ += "  return &tt;";
    code_ += "}";
    code_ += "";
  }